

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderArrowDockMenu(ImDrawList *draw_list,ImVec2 p_min,float sz,ImU32 col)

{
  ImVec2 pos;
  ImVec2 half_sz;
  float fVar1;
  float fVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar3;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  float local_28;
  
  fVar1 = p_min.x;
  fVar2 = p_min.y;
  local_60.y = sz * 0.15 + fVar2;
  local_60.x = sz * 0.2 + fVar1;
  fVar3 = sz * 0.3;
  local_68.y = fVar2 + fVar3;
  local_68.x = sz * 0.8 + fVar1;
  if (0xffffff < col) {
    local_38._8_4_ = in_XMM0_Dc;
    local_38._0_8_ = p_min;
    local_38._12_4_ = in_XMM0_Dd;
    local_58 = ZEXT416((uint)fVar3);
    local_48 = fVar2;
    fStack_44 = fVar2;
    fStack_40 = fVar2;
    fStack_3c = fVar2;
    local_28 = sz;
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_60,&local_68,col);
    sz = local_28;
    fVar1 = (float)local_38._0_4_;
    fVar2 = local_48;
    fVar3 = (float)local_58._0_4_;
  }
  pos.y = sz * 0.85 + fVar2;
  pos.x = sz * 0.5 + fVar1;
  half_sz.y = sz * 0.4;
  half_sz.x = fVar3;
  RenderArrowPointingAt(draw_list,pos,half_sz,3,col);
  return;
}

Assistant:

void ImGui::RenderArrowDockMenu(ImDrawList* draw_list, ImVec2 p_min, float sz, ImU32 col)
{
    draw_list->AddRectFilled(p_min + ImVec2(sz * 0.20f, sz * 0.15f), p_min + ImVec2(sz * 0.80f, sz * 0.30f), col);
    RenderArrowPointingAt(draw_list, p_min + ImVec2(sz * 0.50f, sz * 0.85f), ImVec2(sz * 0.30f, sz * 0.40f), ImGuiDir_Down, col);
}